

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

void __thiscall
OpenMD::ZConstraintForceModifier::~ZConstraintForceModifier(ZConstraintForceModifier *this)

{
  ~ZConstraintForceModifier(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

ZConstraintForceModifier::~ZConstraintForceModifier() { delete fzOut; }